

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chi_square_dist.hpp
# Opt level: O0

result_type_conflict1 __thiscall
trng::chi_square_dist<float>::pdf(chi_square_dist<float> *this,result_type_conflict1 x)

{
  int iVar1;
  param_type *in_RDI;
  float in_XMM0_Da;
  float fVar2;
  double dVar3;
  double dVar4;
  undefined4 uVar5;
  undefined4 local_4;
  
  if (0.0 <= in_XMM0_Da) {
    uVar5 = 0;
    iVar1 = param_type::nu(in_RDI);
    dVar3 = std::pow((double)(ulong)(uint)(in_XMM0_Da / 2.0),
                     (double)CONCAT44(uVar5,(float)iVar1 / 2.0 - 1.0));
    param_type::nu(in_RDI);
    fVar2 = math::ln_Gamma(0.0);
    dVar4 = std::exp((double)(ulong)(uint)(in_XMM0_Da / 2.0 + fVar2));
    local_4 = SUB84(dVar3,0) / (SUB84(dVar4,0) * 2.0);
  }
  else {
    local_4 = 0.0;
  }
  return local_4;
}

Assistant:

pdf(result_type x) const {
      if (x < 0)
        return 0;
      x /= 2;
      return math::pow(x, P.nu() / result_type(2) - 1) /
             (math::exp(x + math::ln_Gamma(P.nu() / result_type(2))) * 2);
    }